

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

void __thiscall Js::JavascriptArray::ValidateArrayCommon(JavascriptArray *this)

{
  SparseArraySegmentBase *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  DynamicObjectFlags DVar5;
  undefined4 *puVar6;
  SegmentBTreeRoot *this_00;
  char *message;
  Type *pTVar7;
  char *error;
  SparseArraySegmentBase *seg;
  uint lineNumber;
  ArraySegmentsVisitor local_40;
  ArraySegmentsVisitor visitor;
  
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  pTVar7 = (Type *)((long)this->segmentUnion + 0x20);
  if ((DVar5 & HasSegmentMap) == None) {
    pTVar7 = &this->segmentUnion;
  }
  visitor.seg = (pTVar7->lastUsedSegment).ptr;
  if ((visitor.seg == (SparseArraySegmentBase *)0x0) ||
     ((this->head).ptr == (SparseArraySegmentBase *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4c,"(this != nullptr && head && lastUsedSegment)",
                                "Array should not be null");
    if (!bVar3) goto LAB_00b94021;
    *puVar6 = 0;
  }
  if (((this->head).ptr)->left != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e4d,"(head->left == 0)",
                                "Array always should have a segment starting at zero");
    if (!bVar3) goto LAB_00b94021;
    *puVar6 = 0;
  }
  seg = (this->head).ptr;
  if (seg != (SparseArraySegmentBase *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    bVar3 = false;
    do {
      if (seg == visitor.seg) {
        bVar3 = true;
      }
      if (seg->size < seg->length) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2e59,"(seg->length <= seg->size)",
                                    "Length greater than size not possible");
        if (!bVar4) goto LAB_00b94021;
        *puVar6 = 0;
      }
      pSVar1 = (seg->next).ptr;
      if (pSVar1 == (SparseArraySegmentBase *)0x0) {
        if (CARRY4(seg->left,seg->length)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2e64,"(seg->length <= MaxArrayLength - seg->left)",
                                      "Segment index range overflow");
          if (!bVar4) goto LAB_00b94021;
          *puVar6 = 0;
        }
        if ((this->super_ArrayObject).length < seg->length + seg->left) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          lineNumber = 0x2e65;
          error = "(seg->left + seg->length <= this->length)";
          message = "Segment index range exceeds array length";
          goto LAB_00b93f68;
        }
      }
      else {
        if (pSVar1->left <= seg->left) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2e5e,"(seg->left < next->left)",
                                      "Segment is adjacent to or overlaps with next segment");
          if (!bVar4) goto LAB_00b94021;
          *puVar6 = 0;
        }
        if (pSVar1->left - seg->left < seg->size) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2e5f,"(seg->size <= (next->left - seg->left))",
                                      "Segment is adjacent to or overlaps with next segment");
          if (!bVar4) goto LAB_00b94021;
          *puVar6 = 0;
        }
        bVar4 = SparseArraySegmentBase::IsLeafSegment
                          (seg,((((((this->super_ArrayObject).super_DynamicObject.
                                    super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                super_JavascriptLibraryBase).scriptContext.ptr)->recycler);
        if (bVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          lineNumber = 0x2e60;
          error = 
          "(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()))";
          message = "Leaf segment with a next pointer";
LAB_00b93f68:
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,lineNumber,error,message);
          if (!bVar4) goto LAB_00b94021;
          *puVar6 = 0;
        }
      }
      seg = pSVar1;
    } while (pSVar1 != (SparseArraySegmentBase *)0x0);
    if (bVar3) goto LAB_00b93fe8;
  }
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar5 & HasSegmentMap) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e6a,"(foundLastUsedSegment || HasSegmentMap())",
                                "Corrupt lastUsedSegment in array header");
    if (!bVar3) {
LAB_00b94021:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
LAB_00b93fe8:
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar5 & HasSegmentMap) != None) {
    local_40.seg = (this->head).ptr;
    this_00 = GetSegmentMap(this);
    SegmentBTree::Walk<ArraySegmentsVisitor>(&this_00->super_SegmentBTree,&local_40);
  }
  return;
}

Assistant:

void JavascriptArray::ValidateArrayCommon()
    {
        SparseArraySegmentBase * lastUsedSegment = this->GetLastUsedSegment();
        AssertMsg(this != nullptr && head && lastUsedSegment, "Array should not be null");
        AssertMsg(head->left == 0, "Array always should have a segment starting at zero");

        // Simple segments validation
        bool foundLastUsedSegment = false;
        SparseArraySegmentBase *seg = head;
        while(seg != nullptr)
        {
            if (seg == lastUsedSegment)
            {
                foundLastUsedSegment = true;
            }

            AssertMsg(seg->length <= seg->size , "Length greater than size not possible");

            SparseArraySegmentBase* next = seg->next;
            if (next != nullptr)
            {
                AssertMsg(seg->left < next->left, "Segment is adjacent to or overlaps with next segment");
                AssertMsg(seg->size <= (next->left - seg->left), "Segment is adjacent to or overlaps with next segment");
                AssertMsg(!SparseArraySegmentBase::IsLeafSegment(seg, this->GetScriptContext()->GetRecycler()), "Leaf segment with a next pointer");
            }
            else
            {
                AssertMsg(seg->length <= MaxArrayLength - seg->left, "Segment index range overflow");
                AssertMsg(seg->left + seg->length <= this->length, "Segment index range exceeds array length");
            }

            seg = next;
        }
        AssertMsg(foundLastUsedSegment || HasSegmentMap(), "Corrupt lastUsedSegment in array header");

        // Validate segmentMap if present
        if (HasSegmentMap())
        {
            ArraySegmentsVisitor visitor(head);
            GetSegmentMap()->Walk(visitor);
        }
    }